

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O1

void demo_textprintf_centre(ALLEGRO_FONT *font,int x,int y,ALLEGRO_COLOR col,char *format,...)

{
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [512];
  undefined8 local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  undefined1 local_2d8 [32];
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined8 local_248;
  undefined8 local_238;
  char local_228 [520];
  
  local_2e8 = local_2d8;
  if (in_AL != '\0') {
    local_288 = in_XMM2_Qa;
    local_278 = in_XMM3_Qa;
    local_268 = in_XMM4_Qa;
    local_258 = in_XMM5_Qa;
    local_248 = in_XMM6_Qa;
    local_238 = in_XMM7_Qa;
  }
  local_2f0 = &stack0x00000008;
  local_2f8 = 0x5000000020;
  local_2b8 = in_R8;
  local_2b0 = in_R9;
  vsnprintf(local_228,0x200,format,&local_2f8);
  demo_textprintf_ex(font,x,y,2,0x1128aa,col.r,col.b,local_228);
  return;
}

Assistant:

void demo_textprintf_centre(const ALLEGRO_FONT *font, int x, int y,
                     ALLEGRO_COLOR col, const char *format, ...)
{
   char buf[512];

   va_list ap;

   va_start(ap, format);
   vsnprintf(buf, sizeof(buf), format, ap);
   va_end(ap);

   demo_textprintf_ex(font, x, y, col, 2, "%s", buf);
}